

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::SetBinaryDirectory(cmState *this,string *binaryDirectory)

{
  string *path;
  string local_38;
  string *local_18;
  string *binaryDirectory_local;
  cmState *this_local;
  
  path = &this->BinaryDirectory;
  local_18 = binaryDirectory;
  binaryDirectory_local = (string *)this;
  std::__cxx11::string::operator=((string *)path,(string *)binaryDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_38,path);
  cmsys::SystemTools::SplitPath(&local_38,&this->BinaryDirectoryComponents,true);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmState::SetBinaryDirectory(std::string const& binaryDirectory)
{
  this->BinaryDirectory = binaryDirectory;
  cmSystemTools::ConvertToUnixSlashes(this->BinaryDirectory);

  cmSystemTools::SplitPath(
      cmSystemTools::CollapseFullPath(this->BinaryDirectory),
        this->BinaryDirectoryComponents);
}